

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::assign_helper(QString *this,char32_t *data,qsizetype len)

{
  QByteArrayView in;
  bool bVar1;
  char32_t *unicode;
  qsizetype qVar2;
  char16_t *pcVar3;
  QChar *pQVar4;
  State *in_RDX;
  QChar *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  QChar *end;
  QChar *begin;
  qsizetype offset;
  qsizetype requiredCapacity;
  QByteArrayView ba;
  State state;
  undefined4 in_stack_ffffffffffffff08;
  Flag in_stack_ffffffffffffff0c;
  QString *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  QFlagsStorage<QStringConverterBase::Flag> f;
  QByteArrayView *in_stack_ffffffffffffff20;
  char32_t *pcVar5;
  DataEndianness endian;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  anon_union_16_2_cfafc8b3_for_State_4 aStack_20;
  ClearDataFn p_Stack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  unicode = (char32_t *)((long)in_RDX << 1);
  pcVar5 = unicode;
  qVar2 = capacity((QString *)0x50a6c1);
  endian = (DataEndianness)((ulong)pcVar5 >> 0x20);
  if ((qVar2 < (long)unicode) || (bVar1 = isDetached((QString *)0x50a6dc), !bVar1)) {
    fromUcs4(unicode,(qsizetype)in_RDI);
    operator=(in_stack_ffffffffffffff10,
              (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    ~QString((QString *)0x50a873);
  }
  else {
    qVar2 = QArrayDataPointer<char16_t>::freeSpaceAtBegin
                      ((QArrayDataPointer<char16_t> *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (qVar2 != 0) {
      pcVar3 = QArrayDataPointer<char16_t>::begin((QArrayDataPointer<char16_t> *)0x50a706);
      QArrayDataPointer<char16_t>::setBegin(in_RDI,pcVar3 + -qVar2);
    }
    pcVar3 = QArrayDataPointer<char16_t>::begin((QArrayDataPointer<char16_t> *)0x50a72a);
    QByteArrayView::QByteArrayView<std::byte,_true>
              (in_stack_ffffffffffffff20,
               (byte *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (qsizetype)in_stack_ffffffffffffff10);
    aStack_20.d[1] = &DAT_aaaaaaaaaaaaaaaa;
    p_Stack_10 = (ClearDataFn)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    aStack_20.d[0] = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    f.i = 0;
    QFlags<QStringConverterBase::Flag>::QFlags
              ((QFlags<QStringConverterBase::Flag> *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff0c);
    QStringConverterBase::State::State((State *)&local_38,(Flags)f.i);
    in.m_data = &DAT_aaaaaaaaaaaaaaaa;
    in.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = QUtf32::convertToUnicode(in_RSI,in,in_RDX,endian);
    in_RDI->size = (long)pQVar4 - (long)pcVar3 >> 1;
    pcVar3 = QArrayDataPointer<char16_t>::data(in_RDI);
    pcVar3[in_RDI->size] = L'\0';
    QStringConverterBase::State::~State((State *)0x50a823);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString &QString::assign_helper(const char32_t *data, qsizetype len)
{
    // worst case: each char32_t requires a surrogate pair, so
    const auto requiredCapacity = len * 2;
    if (requiredCapacity <= capacity() && isDetached()) {
        const auto offset = d.freeSpaceAtBegin();
        if (offset)
            d.setBegin(d.begin() - offset);
        auto begin = reinterpret_cast<QChar *>(d.begin());
        auto ba = QByteArrayView(reinterpret_cast<const std::byte*>(data), len * sizeof(char32_t));
        QStringConverter::State state;
        const auto end = QUtf32::convertToUnicode(begin, ba, &state, DetectEndianness);
        d.size = end - begin;
        d.data()[d.size] = u'\0';
    } else {
        *this = QString::fromUcs4(data, len);
    }
    return *this;
}